

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

void __thiscall OpenMD::Snapshot::clearDerivedProperties(Snapshot *this)

{
  Vector3d *pVVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 local_48 [9];
  
  lVar4 = 0;
  (this->frameData).excludedPotential = 0.0;
  (this->frameData).selfPotential = 0.0;
  (this->frameData).totalEnergy = 0.0;
  (this->frameData).translationalKinetic = 0.0;
  (this->frameData).rotationalKinetic = 0.0;
  (this->frameData).electronicKinetic = 0.0;
  (this->frameData).kineticEnergy = 0.0;
  (this->frameData).potentialEnergy = 0.0;
  (this->frameData).shortRangePotential = 0.0;
  (this->frameData).longRangePotential = 0.0;
  (this->frameData).pressure = 0.0;
  (this->frameData).temperature = 0.0;
  local_48[8] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  do {
    *(undefined8 *)
     ((long)(this->frameData).pressureTensor.super_SquareMatrix<double,_3>.
            super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4 + 0x10) =
         *(undefined8 *)((long)local_48 + lVar4 + 0x10);
    uVar3 = *(undefined8 *)((long)local_48 + lVar4 + 8);
    puVar2 = (undefined8 *)
             ((long)(this->frameData).pressureTensor.super_SquareMatrix<double,_3>.
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4);
    *puVar2 = *(undefined8 *)((long)local_48 + lVar4);
    puVar2[1] = uVar3;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  (this->frameData).systemDipole.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->frameData).systemDipole.super_Vector<double,_3U>.data_[1] = 0.0;
  lVar4 = 0;
  (this->frameData).systemDipole.super_Vector<double,_3U>.data_[2] = 0.0;
  local_48[8] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  do {
    *(undefined8 *)
     ((long)(this->frameData).systemQuadrupole.super_SquareMatrix<double,_3>.
            super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4 + 0x10) =
         *(undefined8 *)((long)local_48 + lVar4 + 0x10);
    uVar3 = *(undefined8 *)((long)local_48 + lVar4 + 8);
    puVar2 = (undefined8 *)
             ((long)(this->frameData).systemQuadrupole.super_SquareMatrix<double,_3>.
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4);
    *puVar2 = *(undefined8 *)((long)local_48 + lVar4);
    puVar2[1] = uVar3;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  pVVar1 = &(this->frameData).COM;
  (this->frameData).electronicTemperature = 0.0;
  (this->frameData).netCharge = 0.0;
  (this->frameData).chargeMomentum = 0.0;
  (this->frameData).convectiveHeatFlux.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->frameData).convectiveHeatFlux.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->frameData).convectiveHeatFlux.super_Vector<double,_3U>.data_[2] = 0.0;
  if (pVVar1 != (Vector3d *)OpenMD::V3Zero) {
    (this->frameData).COM.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar3 = OpenMD::V3Zero._8_8_;
    (pVVar1->super_Vector<double,_3U>).data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->frameData).COM.super_Vector<double,_3U>.data_[1] = (double)uVar3;
  }
  pVVar1 = &(this->frameData).COMvel;
  if (pVVar1 != (Vector3d *)OpenMD::V3Zero) {
    (this->frameData).COMvel.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar3 = OpenMD::V3Zero._8_8_;
    (pVVar1->super_Vector<double,_3U>).data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->frameData).COMvel.super_Vector<double,_3U>.data_[1] = (double)uVar3;
  }
  pVVar1 = &(this->frameData).COMw;
  if (pVVar1 != (Vector3d *)OpenMD::V3Zero) {
    (this->frameData).COMw.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar3 = OpenMD::V3Zero._8_8_;
    (pVVar1->super_Vector<double,_3U>).data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->frameData).COMw.super_Vector<double,_3U>.data_[1] = (double)uVar3;
  }
  this->hasPressure = false;
  this->hasTemperature = false;
  this->hasElectronicTemperature = false;
  this->hasNetCharge = false;
  this->hasChargeMomentum = false;
  this->hasCOM = false;
  this->hasCOMvel = false;
  this->hasCOMw = false;
  this->hasPressureTensor = false;
  this->hasSystemDipole = false;
  this->hasSystemQuadrupole = false;
  this->hasConvectiveHeatFlux = false;
  this->hasInertiaTensor = false;
  this->hasGyrationalVolume = false;
  this->hasHullVolume = false;
  this->hasBoundingBox = false;
  this->hasTotalEnergy = false;
  this->hasTranslationalKineticEnergy = false;
  this->hasRotationalKineticEnergy = false;
  this->hasElectronicKineticEnergy = false;
  this->hasKineticEnergy = false;
  this->hasShortRangePotential = false;
  this->hasLongRangePotential = false;
  this->hasExcludedPotential = false;
  this->hasSelfPotential = false;
  this->hasPotentialEnergy = false;
  this->hasXYarea = false;
  this->hasXZarea = false;
  this->hasYZarea = false;
  this->hasVolume = false;
  this->hasPressure = false;
  this->hasTemperature = false;
  return;
}

Assistant:

void Snapshot::clearDerivedProperties() {
    frameData.totalEnergy           = 0.0;
    frameData.translationalKinetic  = 0.0;
    frameData.rotationalKinetic     = 0.0;
    frameData.electronicKinetic     = 0.0;
    frameData.kineticEnergy         = 0.0;
    frameData.potentialEnergy       = 0.0;
    frameData.shortRangePotential   = 0.0;
    frameData.longRangePotential    = 0.0;
    frameData.excludedPotential     = 0.0;
    frameData.selfPotential         = 0.0;
    frameData.pressure              = 0.0;
    frameData.temperature           = 0.0;
    frameData.pressureTensor        = Mat3x3d(0.0);
    frameData.systemDipole          = Vector3d(0.0);
    frameData.systemQuadrupole      = Mat3x3d(0.0);
    frameData.convectiveHeatFlux    = Vector3d(0.0, 0.0, 0.0);
    frameData.electronicTemperature = 0.0;
    frameData.netCharge             = 0.0;
    frameData.chargeMomentum        = 0.0;
    frameData.COM                   = V3Zero;
    frameData.COMvel                = V3Zero;
    frameData.COMw                  = V3Zero;

    hasTotalEnergy                = false;
    hasTranslationalKineticEnergy = false;
    hasRotationalKineticEnergy    = false;
    hasElectronicKineticEnergy    = false;
    hasKineticEnergy              = false;
    hasShortRangePotential        = false;
    hasLongRangePotential         = false;
    hasExcludedPotential          = false;
    hasSelfPotential              = false;
    hasPotentialEnergy            = false;
    hasXYarea                     = false;
    hasXZarea                     = false;
    hasYZarea                     = false;
    hasVolume                     = false;
    hasPressure                   = false;
    hasTemperature                = false;
    hasElectronicTemperature      = false;
    hasNetCharge                  = false;
    hasChargeMomentum             = false;
    hasCOM                        = false;
    hasCOMvel                     = false;
    hasCOMw                       = false;
    hasPressureTensor             = false;
    hasSystemDipole               = false;
    hasSystemQuadrupole           = false;
    hasConvectiveHeatFlux         = false;
    hasInertiaTensor              = false;
    hasGyrationalVolume           = false;
    hasHullVolume                 = false;
    hasBoundingBox                = false;
  }